

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OldAccumulator.hpp
# Opt level: O2

void __thiscall OpenMD::VectorAccumulator::VectorAccumulator(VectorAccumulator *this)

{
  (this->super_BaseAccumulator).Count_ = 0;
  (this->super_BaseAccumulator)._vptr_BaseAccumulator = (_func_int **)&PTR_clear_002c2e60;
  Vector<double,_3U>::Vector(&(this->Val_).super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&(this->Avg_).super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&(this->Avg2_).super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&(this->Total_).super_Vector<double,_3U>);
  (**(this->super_BaseAccumulator)._vptr_BaseAccumulator)(this);
  return;
}

Assistant:

VectorAccumulator() : BaseAccumulator() { this->clear(); }